

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateFlopSetReset
              (Cba_Ntk_t *p,Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int *pIndexSet,int *pIndexRst,
              int *pBitSet,int *pBitRst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_5c;
  int k;
  int ActId;
  int FormId;
  int IndexRst;
  int IndexSet;
  int iSigRst;
  int iSigSet;
  int *pBitSet_local;
  int *pIndexRst_local;
  int *pIndexSet_local;
  Vec_Int_t *vBox_local;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  IndexSet = -1;
  IndexRst = -1;
  FormId = -1;
  ActId = -1;
  Cba_NtkCleanMap2(p);
  iVar1 = Cba_NtkStrId(p,"set");
  Cba_NtkSetMap2(p,iVar1,1);
  iVar1 = Cba_NtkStrId(p,"reset");
  Cba_NtkSetMap2(p,iVar1,2);
  for (local_5c = 0; iVar1 = Vec_IntSize(vBox), local_5c + 1 < iVar1; local_5c = local_5c + 2) {
    iVar1 = Vec_IntEntry(vBox,local_5c);
    iVar3 = Vec_IntEntry(vBox,local_5c + 1);
    iVar2 = Cba_NtkGetMap2(p,iVar1);
    if (iVar2 == 1) {
      FormId = local_5c + 1;
      IndexSet = iVar3;
    }
    else {
      iVar1 = Cba_NtkGetMap2(p,iVar1);
      if (iVar1 == 2) {
        ActId = local_5c + 1;
        IndexRst = iVar3;
      }
    }
  }
  if ((-1 < IndexSet) && (-1 < IndexRst)) {
    if (pIndexSet != (int *)0x0) {
      *pBitSet = 0;
    }
    if (pIndexRst != (int *)0x0) {
      *pBitRst = 0;
    }
    if (pBitSet != (int *)0x0) {
      *pBitSet = 0;
    }
    if (pBitRst != (int *)0x0) {
      *pBitRst = 0;
    }
    if ((IndexSet == -1) || (IndexRst == -1)) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Prs_CreateBitSignal(pNtk,IndexSet);
      iVar3 = Prs_CreateBitSignal(pNtk,IndexRst);
      if ((iVar1 == -1) || (iVar3 == -1)) {
        p_local._4_4_ = 0;
      }
      else {
        if (pIndexSet != (int *)0x0) {
          *pIndexSet = FormId;
        }
        if (pIndexRst != (int *)0x0) {
          *pIndexRst = ActId;
        }
        if (pBitSet != (int *)0x0) {
          *pBitSet = iVar1;
        }
        if (pBitRst != (int *)0x0) {
          *pBitRst = iVar3;
        }
        p_local._4_4_ = 1;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("iSigSet >= 0 && iSigRst >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                ,0x6a5,
                "int Prs_CreateFlopSetReset(Cba_Ntk_t *, Prs_Ntk_t *, Vec_Int_t *, int *, int *, int *, int *)"
               );
}

Assistant:

int Prs_CreateFlopSetReset( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int * pIndexSet, int * pIndexRst, int * pBitSet, int * pBitRst )
{
    int iSigSet = -1, iSigRst = -1;
    int IndexSet = -1, IndexRst = -1;
    int FormId, ActId, k;
    // mark set and reset
    Cba_NtkCleanMap2( p );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "set"), 1 );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "reset"), 2 );
    // check the inputs
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
        if ( Cba_NtkGetMap2(p, FormId) == 1 ) // set
            iSigSet = ActId, IndexSet = k+1;
        else if ( Cba_NtkGetMap2(p, FormId) == 2 ) // reset
            iSigRst = ActId, IndexRst = k+1;
    assert( iSigSet >= 0 && iSigRst >= 0 );
    if ( pIndexSet ) *pBitSet = 0;
    if ( pIndexRst ) *pBitRst = 0;
    if ( pBitSet )   *pBitSet = 0;
    if ( pBitRst )   *pBitRst = 0;
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    iSigSet = Prs_CreateBitSignal(pNtk, iSigSet);
    iSigRst = Prs_CreateBitSignal(pNtk, iSigRst);
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    if ( pIndexSet ) *pIndexSet = IndexSet;
    if ( pIndexRst ) *pIndexRst = IndexRst;
    if ( pBitSet )   *pBitSet = iSigSet;
    if ( pBitRst )   *pBitRst = iSigRst;
    return 1;
}